

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::Scrollbar(ImGuiLayoutType direction)

{
  uint uVar1;
  int in_EDI;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImRect grab_rect;
  ImU32 grab_col;
  float scroll_v_norm;
  bool seek_absolute;
  float clicked_v_norm;
  float *click_delta_to_grab_center_v;
  float mouse_pos_v;
  float scrollbar_pos_v;
  float grab_v_norm;
  float scroll_ratio;
  float scroll_max;
  bool previously_held;
  bool hovered;
  bool held;
  float grab_h_norm;
  float grab_h_pixels;
  float win_size_v;
  float win_size_contents_v;
  float win_size_avail_v;
  float scroll_v;
  float scrollbar_size_v;
  int window_rounding_corners;
  ImRect bb;
  float border_size;
  ImRect window_rect;
  float other_scrollbar_size_w;
  bool other_scrollbar;
  ImGuiID id;
  ImGuiStyle *style;
  bool horizontal;
  ImGuiWindow *window;
  ImGuiContext *g;
  float in_stack_fffffffffffffeb0;
  float in_stack_fffffffffffffeb4;
  float in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffebc;
  ImRect *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  ImGuiButtonFlags in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  float lhs;
  float fVar7;
  undefined4 in_stack_fffffffffffffed4;
  float fVar8;
  float fVar9;
  float fVar10;
  ImGuiID id_00;
  ImRect *bb_00;
  float local_100;
  float local_f8;
  byte local_f1;
  ImVec2 local_64;
  uint local_5c;
  ImRect local_58;
  float local_48;
  ImRect local_44;
  float local_34;
  byte local_2d;
  ImGuiID local_2c;
  ImGuiStyle *local_28;
  byte local_19;
  ImGuiWindow *local_18;
  ImGuiContext *local_10;
  
  local_10 = GImGui;
  local_18 = GImGui->CurrentWindow;
  local_19 = in_EDI == 0;
  local_28 = &GImGui->Style;
  local_2c = ImGuiWindow::GetID((ImGuiWindow *)
                                CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8
                                                ),(char *)in_stack_fffffffffffffec0);
  if ((local_19 & 1) == 0) {
    local_f1 = local_18->ScrollbarX;
  }
  else {
    local_f1 = local_18->ScrollbarY;
  }
  local_2d = local_f1 & 1;
  if (local_2d == 0) {
    local_f8 = 0.0;
  }
  else {
    local_f8 = local_28->ScrollbarSize;
  }
  local_34 = local_f8;
  local_44 = ImGuiWindow::Rect((ImGuiWindow *)0x1770eb);
  local_48 = local_18->WindowBorderSize;
  if ((local_19 & 1) == 0) {
    ImRect::ImRect(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,
                   in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0);
  }
  else {
    ImRect::ImRect(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,
                   in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0);
  }
  if ((local_19 & 1) == 0) {
    fVar3 = ImGuiWindow::TitleBarHeight
                      ((ImGuiWindow *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0))
    ;
    if ((local_18->Flags & 0x400U) == 0) {
      local_100 = 0.0;
    }
    else {
      local_100 = ImGuiWindow::MenuBarHeight
                            ((ImGuiWindow *)
                             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    }
    local_58.Min.y = fVar3 + local_100 + local_58.Min.y;
  }
  fVar3 = ImRect::GetWidth(&local_58);
  if ((0.0 < fVar3) && (fVar3 = ImRect::GetHeight(&local_58), 0.0 < fVar3)) {
    if ((local_19 & 1) == 0) {
      bVar2 = false;
      if ((local_18->Flags & 1U) != 0) {
        bVar2 = (local_18->Flags & 0x400U) == 0;
      }
      local_5c = 0;
      if (bVar2) {
        local_5c = 2;
      }
      uVar1 = 8;
      if ((local_2d & 1) != 0) {
        uVar1 = 0;
      }
      local_5c = local_5c | uVar1;
    }
    else {
      local_5c = 8;
      if ((local_2d & 1) != 0) {
        local_5c = 0;
      }
      local_5c = local_5c | 4;
    }
    id_00 = (ImGuiID)((ulong)local_18->DrawList >> 0x20);
    bb_00 = &local_58;
    GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                SUB84(in_stack_fffffffffffffec0,0));
    ImDrawList::AddRectFilled
              ((ImDrawList *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (ImVec2 *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               &in_stack_fffffffffffffec0->Min,(ImU32)in_stack_fffffffffffffebc,
               in_stack_fffffffffffffeb8,(int)in_stack_fffffffffffffeb4);
    fVar3 = ImClamp<float>((float)(int)(((local_58.Max.x - local_58.Min.x) - 2.0) * 0.5),0.0,3.0);
    fVar4 = ImClamp<float>((float)(int)(((local_58.Max.y - local_58.Min.y) - 2.0) * 0.5),0.0,3.0);
    ImVec2::ImVec2(&local_64,-fVar3,-fVar4);
    ImRect::Expand(&local_58,&local_64);
    if ((local_19 & 1) == 0) {
      fVar3 = ImRect::GetHeight(&local_58);
    }
    else {
      fVar3 = ImRect::GetWidth(&local_58);
    }
    if ((local_19 & 1) == 0) {
      fVar4 = (local_18->Scroll).y;
    }
    else {
      fVar4 = (local_18->Scroll).x;
    }
    if ((local_19 & 1) == 0) {
      fVar8 = (local_18->SizeFull).y;
    }
    else {
      fVar8 = (local_18->SizeFull).x;
    }
    fVar5 = fVar8 - local_34;
    if ((local_19 & 1) == 0) {
      lhs = (local_18->SizeContents).y;
    }
    else {
      lhs = (local_18->SizeContents).x;
    }
    fVar7 = lhs;
    fVar9 = fVar4;
    fVar10 = fVar3;
    fVar6 = ImMax<float>(lhs,fVar5);
    fVar6 = ImMax<float>(fVar6,1.0);
    fVar6 = ImClamp<float>(fVar3 * (fVar5 / fVar6),local_28->GrabMinSize,fVar3);
    ButtonBehavior(bb_00,id_00,(bool *)CONCAT44(fVar10,fVar9),(bool *)CONCAT44(fVar8,fVar7),
                   in_stack_fffffffffffffecc);
    fVar5 = ImMax<float>(1.0,lhs - fVar5);
    fVar4 = ImSaturate(fVar4 / fVar5);
    fVar3 = (fVar4 * (fVar3 - fVar6)) / fVar3;
    fVar4 = 2.10195e-44;
    GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                SUB84(in_stack_fffffffffffffec0,0));
    ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    if ((local_19 & 1) == 0) {
      ImLerp<float>(local_58.Min.y,local_58.Max.y,fVar3);
      fVar3 = ImLerp<float>(local_58.Min.y,local_58.Max.y,fVar3);
      ImMin<float>(fVar3 + fVar6,local_44.Max.y);
      ImRect::ImRect(in_stack_fffffffffffffec0,fVar4,in_stack_fffffffffffffeb8,
                     in_stack_fffffffffffffeb4,local_58.Min.x);
    }
    else {
      in_stack_fffffffffffffeb8 = ImLerp<float>(local_58.Min.x,local_58.Max.x,fVar3);
      in_stack_fffffffffffffeb4 = local_58.Min.y;
      fVar3 = ImLerp<float>(local_58.Min.x,local_58.Max.x,fVar3);
      ImMin<float>(fVar3 + fVar6,local_44.Max.x);
      ImRect::ImRect(in_stack_fffffffffffffec0,fVar4,in_stack_fffffffffffffeb8,
                     in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0);
    }
    ImDrawList::AddRectFilled
              ((ImDrawList *)CONCAT44(fVar8,fVar7),
               (ImVec2 *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               &in_stack_fffffffffffffec0->Min,(ImU32)fVar4,in_stack_fffffffffffffeb8,
               (int)in_stack_fffffffffffffeb4);
  }
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiLayoutType direction)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const bool horizontal = (direction == ImGuiLayoutType_Horizontal);
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(horizontal ? "#SCROLLX" : "#SCROLLY");

    // Render background
    bool other_scrollbar = (horizontal ? window->ScrollbarY : window->ScrollbarX);
    float other_scrollbar_size_w = other_scrollbar ? style.ScrollbarSize : 0.0f;
    const ImRect window_rect = window->Rect();
    const float border_size = window->WindowBorderSize;
    ImRect bb = horizontal
        ? ImRect(window->Pos.x + border_size, window_rect.Max.y - style.ScrollbarSize, window_rect.Max.x - other_scrollbar_size_w - border_size, window_rect.Max.y - border_size)
        : ImRect(window_rect.Max.x - style.ScrollbarSize, window->Pos.y + border_size, window_rect.Max.x - border_size, window_rect.Max.y - other_scrollbar_size_w - border_size);
    if (!horizontal)
        bb.Min.y += window->TitleBarHeight() + ((window->Flags & ImGuiWindowFlags_MenuBar) ? window->MenuBarHeight() : 0.0f);
    if (bb.GetWidth() <= 0.0f || bb.GetHeight() <= 0.0f)
        return;

    int window_rounding_corners;
    if (horizontal)
        window_rounding_corners = ImDrawCornerFlags_BotLeft | (other_scrollbar ? 0 : ImDrawCornerFlags_BotRight);
    else
        window_rounding_corners = (((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar)) ? ImDrawCornerFlags_TopRight : 0) | (other_scrollbar ? 0 : ImDrawCornerFlags_BotRight);
    window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_ScrollbarBg), window->WindowRounding, window_rounding_corners);
    bb.Expand(ImVec2(-ImClamp((float)(int)((bb.Max.x - bb.Min.x - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp((float)(int)((bb.Max.y - bb.Min.y - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    float scrollbar_size_v = horizontal ? bb.GetWidth() : bb.GetHeight();
    float scroll_v = horizontal ? window->Scroll.x : window->Scroll.y;
    float win_size_avail_v = (horizontal ? window->SizeFull.x : window->SizeFull.y) - other_scrollbar_size_w;
    float win_size_contents_v = horizontal ? window->SizeContents.x : window->SizeContents.y;

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(win_size_contents_v, win_size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const float win_size_v = ImMax(ImMax(win_size_contents_v, win_size_avail_v), 1.0f);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * (win_size_avail_v / win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    const bool previously_held = (g.ActiveId == id);
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    float scroll_max = ImMax(1.0f, win_size_contents_v - win_size_avail_v);
    float scroll_ratio = ImSaturate(scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;
    if (held && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = horizontal ? bb.Min.x : bb.Min.y;
        float mouse_pos_v = horizontal ? g.IO.MousePos.x : g.IO.MousePos.y;
        float* click_delta_to_grab_center_v = horizontal ? &g.ScrollbarClickDeltaToGrabCenter.x : &g.ScrollbarClickDeltaToGrabCenter.y;

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (!previously_held)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            if (clicked_v_norm >= grab_v_norm && clicked_v_norm <= grab_v_norm + grab_h_norm)
            {
                *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
            }
            else
            {
                seek_absolute = true;
                *click_delta_to_grab_center_v = 0.0f;
            }
        }

        // Apply scroll
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of SizeContents and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - *click_delta_to_grab_center_v - grab_h_norm*0.5f) / (1.0f - grab_h_norm));
        scroll_v = (float)(int)(0.5f + scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));
        if (horizontal)
            window->Scroll.x = scroll_v;
        else
            window->Scroll.y = scroll_v;

        // Update values for rendering
        scroll_ratio = ImSaturate(scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
    }

    // Render
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab);
    ImRect grab_rect;
    if (horizontal)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImMin(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, window_rect.Max.x), bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImMin(ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels, window_rect.Max.y));
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);
}